

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LargeHeapBucket.cpp
# Opt level: O0

void __thiscall
Memory::LargeHeapBucket::ExplicitFree(LargeHeapBucket *this,void *object,size_t sizeCat)

{
  code *pcVar1;
  bool bVar2;
  uchar uVar3;
  size_t sVar4;
  undefined4 *puVar5;
  Recycler *this_00;
  FreeObject *freeObject;
  LargeObjectHeader *dbgHeader;
  LargeHeapBlock *largeHeapBlock;
  HeapBlock *heapBlock;
  LargeObjectHeader *header;
  size_t sizeCat_local;
  void *object_local;
  LargeHeapBucket *this_local;
  
  header = (LargeObjectHeader *)sizeCat;
  sizeCat_local = (size_t)object;
  object_local = this;
  sVar4 = HeapInfo::GetMediumObjectAlignedSizeNoCheck(sizeCat);
  if (sVar4 != (this->super_HeapBucket).sizeCat) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/LargeHeapBucket.cpp"
                       ,0x1d7,
                       "(HeapInfo::GetMediumObjectAlignedSizeNoCheck(sizeCat) == this->sizeCat)",
                       "HeapInfo::GetMediumObjectAlignedSizeNoCheck(sizeCat) == this->sizeCat");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  heapBlock = (HeapBlock *)LargeHeapBlock::GetHeaderFromAddress((void *)sizeCat_local);
  uVar3 = LargeObjectHeader::GetAttributes
                    ((LargeObjectHeader *)heapBlock,
                     ((this->super_HeapBucket).heapInfo)->recycler->Cookie);
  if (uVar3 != '\0') {
    uVar3 = LargeObjectHeader::GetAttributes
                      ((LargeObjectHeader *)heapBlock,
                       ((this->super_HeapBucket).heapInfo)->recycler->Cookie);
    if (uVar3 != ' ') {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/LargeHeapBucket.cpp"
                         ,0x1d9,
                         "(header->GetAttributes(this->heapInfo->recycler->Cookie) == ObjectInfoBits::NoBit || header->GetAttributes(this->heapInfo->recycler->Cookie) == ObjectInfoBits::LeafBit)"
                         ,
                         "header->GetAttributes(this->heapInfo->recycler->Cookie) == ObjectInfoBits::NoBit || header->GetAttributes(this->heapInfo->recycler->Cookie) == ObjectInfoBits::LeafBit"
                        );
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 0;
    }
  }
  if ((heapBlock->isPendingConcurrentSweep >> 3 & 1U) != 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/LargeHeapBucket.cpp"
                       ,0x1da,"(!header->isExplicitFreed)","!header->isExplicitFreed");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  heapBlock->isPendingConcurrentSweep = (bool)(heapBlock->isPendingConcurrentSweep & 0xf7U | 8);
  if ((LargeObjectHeader *)heapBlock->address < header) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/LargeHeapBucket.cpp"
                       ,0x1dc,"(header->objectSize >= sizeCat)","header->objectSize >= sizeCat");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  this_00 = HeapBucket::GetRecycler(&this->super_HeapBucket);
  largeHeapBlock = (LargeHeapBlock *)Recycler::FindHeapBlock(this_00,(void *)sizeCat_local);
  if (largeHeapBlock == (LargeHeapBlock *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/LargeHeapBucket.cpp"
                       ,0x1e0,"(heapBlock != nullptr)","heapBlock != nullptr");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  bVar2 = HeapBlock::IsLargeHeapBlock(&largeHeapBlock->super_HeapBlock);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/LargeHeapBucket.cpp"
                       ,0x1e1,"(heapBlock->IsLargeHeapBlock())","heapBlock->IsLargeHeapBlock()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  dbgHeader = (LargeObjectHeader *)largeHeapBlock;
  bVar2 = LargeHeapBlock::GetObjectHeader
                    (largeHeapBlock,(void *)sizeCat_local,(LargeObjectHeader **)&freeObject);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/LargeHeapBucket.cpp"
                       ,0x1e5,"(largeHeapBlock->GetObjectHeader(object, &dbgHeader))",
                       "largeHeapBlock->GetObjectHeader(object, &dbgHeader)");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  if ((HeapBlock *)freeObject != heapBlock) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/LargeHeapBucket.cpp"
                       ,0x1e6,"(dbgHeader == header)","dbgHeader == header");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  sVar4 = sizeCat_local;
  FreeObject::SetNext((FreeObject *)sizeCat_local,this->explicitFreeList);
  this->explicitFreeList = (FreeObject *)sVar4;
  LargeObjectHeader::SetAttributes
            ((LargeObjectHeader *)heapBlock,((this->super_HeapBucket).heapInfo)->recycler->Cookie,
             ' ');
  return;
}

Assistant:

void
LargeHeapBucket::ExplicitFree(void * object, size_t sizeCat)
{
    Assert(HeapInfo::GetMediumObjectAlignedSizeNoCheck(sizeCat) == this->sizeCat);
    LargeObjectHeader * header = LargeHeapBlock::GetHeaderFromAddress(object);
    Assert(header->GetAttributes(this->heapInfo->recycler->Cookie) == ObjectInfoBits::NoBit || header->GetAttributes(this->heapInfo->recycler->Cookie) == ObjectInfoBits::LeafBit);
    Assert(!header->isExplicitFreed);
    DebugOnly(header->isExplicitFreed = true);
    Assert(header->objectSize >= sizeCat);

#if DBG
    HeapBlock* heapBlock = this->GetRecycler()->FindHeapBlock(object);
    Assert(heapBlock != nullptr);
    Assert(heapBlock->IsLargeHeapBlock());

    LargeHeapBlock * largeHeapBlock = (LargeHeapBlock *)heapBlock;
    LargeObjectHeader * dbgHeader;
    Assert(largeHeapBlock->GetObjectHeader(object, &dbgHeader));
    Assert(dbgHeader == header);
#endif

    FreeObject * freeObject = (FreeObject *)object;
    freeObject->SetNext(this->explicitFreeList);
    this->explicitFreeList = freeObject;
    header->SetAttributes(this->heapInfo->recycler->Cookie, ObjectInfoBits::LeafBit);       // We can stop scanning it now.


}